

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basiclu_wrapper.cc
# Opt level: O1

void __thiscall
ipx::BasicLu::_GetFactors
          (BasicLu *this,SparseMatrix *L,SparseMatrix *U,Int *rowperm,Int *colperm,
          vector<int,_std::allocator<int>_> *dependent_cols)

{
  iterator __position;
  lu_int lVar1;
  lu_int *Ucolptr;
  logic_error *this_00;
  int nrow;
  pointer Uvalue_;
  pointer piVar2;
  pointer pdVar3;
  int local_54;
  pointer local_50;
  pointer local_48;
  Int *local_40;
  Int *local_38;
  
  pdVar3 = (this->xstore_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  nrow = (int)pdVar3[0x40];
  local_40 = colperm;
  local_38 = rowperm;
  if (L == (SparseMatrix *)0x0) {
    pdVar3 = (double *)0x0;
    local_50 = (pointer)0x0;
    local_48 = (pointer)0x0;
  }
  else {
    SparseMatrix::resize(L,nrow,nrow,(int)pdVar3[0x4c] + nrow);
    local_48 = (L->colptr_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
    local_50 = (L->rowidx_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
    pdVar3 = (L->values_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  if (U == (SparseMatrix *)0x0) {
    Uvalue_ = (double *)0x0;
    piVar2 = (lu_int *)0x0;
    Ucolptr = (lu_int *)0x0;
  }
  else {
    SparseMatrix::resize
              (U,nrow,nrow,
               (int)(this->xstore_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[0x4d] + nrow);
    Ucolptr = (U->colptr_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    piVar2 = (U->rowidx_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    Uvalue_ = (U->values_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
  }
  lVar1 = basiclu_get_factors((this->istore_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (this->xstore_).super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (this->Li_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (this->Lx_).super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (this->Ui_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (this->Ux_).super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (this->Wi_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (this->Wx_).super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start,local_38,local_40,local_48,
                              local_50,pdVar3,Ucolptr,piVar2,Uvalue_);
  if (lVar1 == 0) {
    if (L != (SparseMatrix *)0x0) {
      RemoveDiagonal(L,(double *)0x0);
    }
    if (dependent_cols != (vector<int,_std::allocator<int>_> *)0x0) {
      local_54 = (int)(this->xstore_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[0x65];
      piVar2 = (dependent_cols->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if ((dependent_cols->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_finish != piVar2) {
        (dependent_cols->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
        super__Vector_impl_data._M_finish = piVar2;
      }
      if (local_54 < nrow) {
        do {
          __position._M_current =
               (dependent_cols->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (dependent_cols->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)dependent_cols,__position,&local_54);
          }
          else {
            *__position._M_current = local_54;
            (dependent_cols->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_finish = __position._M_current + 1;
          }
          local_54 = local_54 + 1;
        } while (local_54 < nrow);
      }
    }
    return;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_00,"basiclu_get_factors failed");
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void BasicLu::_GetFactors(SparseMatrix* L, SparseMatrix* U, Int* rowperm,
                          Int* colperm, std::vector<Int>* dependent_cols) {
    Int *Lbegin = nullptr, *Ubegin = nullptr;
    Int *Lindex = nullptr, *Uindex = nullptr;
    double *Lvalue = nullptr, *Uvalue = nullptr;
    Int dim = xstore_[BASICLU_DIM];
   
    if (L) {
        Int lnz = xstore_[BASICLU_LNZ];
        L->resize(dim, dim, dim+lnz);
        Lbegin = L->colptr();
        Lindex = L->rowidx();
        Lvalue = L->values();
    }
    if (U) {
        Int unz = xstore_[BASICLU_UNZ];
        U->resize(dim, dim, dim+unz);
        Ubegin = U->colptr();
        Uindex = U->rowidx();
        Uvalue = U->values();
    }
    Int status = basiclu_get_factors(istore_.data(), xstore_.data(),
                                     Li_.data(), Lx_.data(),
                                     Ui_.data(), Ux_.data(),
                                     Wi_.data(), Wx_.data(),
                                     rowperm, colperm,
                                     Lbegin, Lindex, Lvalue,
                                     Ubegin, Uindex, Uvalue);
    if (status != BASICLU_OK)
        throw std::logic_error("basiclu_get_factors failed");

    if (L) {
        // Remove unit diagonal from L.
        Int num_dropped = RemoveDiagonal(*L, nullptr);
        assert(num_dropped == dim);
    }
    if (dependent_cols) {
        // Dependent columns are at the end of the BASICLU pivot sequence.
        Int rank = xstore_[BASICLU_RANK];
        dependent_cols->clear();
        for (Int k = rank; k < dim; k++)
            dependent_cols->push_back(k);
    }
}